

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vbroadcasti32x8(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vbroadcasti32x8");
        if ((pMyDisasm->Reserved_).VEX.L < 2) {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\v';
        }
        vex_GE(pMyDisasm,0x6e,0x6e,0x6e,4,4,4);
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vbroadcasti64x4");
        if ((pMyDisasm->Reserved_).VEX.L < 2) {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\n';
        }
        vex_GE(pMyDisasm,0x6e,0x6e,0x6e,4,4,4);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vbroadcasti32x8(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vbroadcasti32x8");
        #endif
        if (GV.VEX.L < 2) GV.ERROR_OPCODE = UD_;
        if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE8;
        vex_GE(pMyDisasm, Arg2_m256_ymm, Arg2_m256_ymm, Arg2_m256_ymm, SSE_REG, SSE_REG, SSE_REG);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vbroadcasti64x4");
        #endif
        if (GV.VEX.L < 2) GV.ERROR_OPCODE = UD_;
        if (GV.VEX.vvvv != 15) GV.ERROR_OPCODE = UD_;
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE4;
        vex_GE(pMyDisasm, Arg2_m256_ymm, Arg2_m256_ymm, Arg2_m256_ymm, SSE_REG, SSE_REG, SSE_REG);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}